

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::anon_unknown_1::AssertionPrinter::printExpressionWas(AssertionPrinter *this)

{
  bool bVar1;
  Code _colourCode;
  Colour local_11;
  AssertionPrinter *pAStack_10;
  Colour colour;
  AssertionPrinter *this_local;
  
  pAStack_10 = this;
  bVar1 = AssertionResult::hasExpression(this->result);
  if (bVar1) {
    std::operator<<((ostream *)this->stream,';');
    _colourCode = anon_unknown.dwarf_9259f::dimColour();
    Colour::Colour(&local_11,_colourCode);
    std::operator<<((ostream *)this->stream," expression was:");
    Colour::~Colour(&local_11);
    printOriginalExpression(this);
  }
  return;
}

Assistant:

void printExpressionWas() {
        if (result.hasExpression()) {
            stream << ';';
            {
                Colour colour(dimColour());
                stream << " expression was:";
            }
            printOriginalExpression();
        }
    }